

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect-selection.cpp
# Opt level: O2

void __thiscall pal::RectHandle::setPosition(RectHandle *this,double p)

{
  Orientation OVar1;
  bool bVar2;
  double dVar3;
  qreal dx;
  double p1;
  double dy;
  
  p1 = this->m_max_pos;
  if (p <= this->m_max_pos) {
    p1 = p;
  }
  if (p1 <= this->m_min_pos) {
    p1 = this->m_min_pos;
  }
  dVar3 = position(this);
  bVar2 = qFuzzyCompare(p1,dVar3);
  if (bVar2) {
    return;
  }
  OVar1 = this->m_orientation;
  dVar3 = position(this);
  if (OVar1 == Horizontal) {
    dx = 0.0;
    dy = p1 - dVar3;
  }
  else {
    dy = 0.0;
    dx = p1 - dVar3;
  }
  QGraphicsItem::moveBy((QGraphicsItem *)&this->super_QGraphicsRectItem,dx,dy);
  moved(this,p1);
  return;
}

Assistant:

void RectHandle::setPosition(double p) {
    p = qBound(m_min_pos, p, m_max_pos);
    if (qFuzzyCompare(p, position()))
        return;

    if (m_orientation == Qt::Horizontal)
        moveBy(0, p - position());
    else
        moveBy(p - position(), 0);

    emit moved(p);
}